

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::Triple(Triple *this,Twine *ArchStr,Twine *VendorStr,Twine *OSStr)

{
  ArchType AVar1;
  SubArchType SVar2;
  VendorType VVar3;
  OSType OVar4;
  ObjectFormatType OVar5;
  StringRef local_c8;
  Child local_a8 [2];
  undefined2 local_98;
  Child local_90 [2];
  undefined2 local_80;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  
  local_80 = 0x108;
  local_90[0].character = '-';
  Twine::concat(&local_78,ArchStr,(Twine *)local_90);
  Twine::concat(&local_60,&local_78,VendorStr);
  local_98 = 0x108;
  local_a8[0].character = '-';
  Twine::concat(&local_48,&local_60,(Twine *)local_a8);
  Twine::concat((Twine *)&local_c8,&local_48,OSStr);
  Twine::str_abi_cxx11_(&this->Data,(Twine *)&local_c8);
  Twine::str_abi_cxx11_((string *)&local_c8,ArchStr);
  AVar1 = parseArch(local_c8);
  std::__cxx11::string::_M_dispose();
  this->Arch = AVar1;
  Twine::str_abi_cxx11_((string *)&local_c8,ArchStr);
  SVar2 = parseSubArch(local_c8);
  std::__cxx11::string::_M_dispose();
  this->SubArch = SVar2;
  Twine::str_abi_cxx11_((string *)&local_c8,VendorStr);
  VVar3 = parseVendor(local_c8);
  std::__cxx11::string::_M_dispose();
  this->Vendor = VVar3;
  Twine::str_abi_cxx11_((string *)&local_c8,OSStr);
  OVar4 = parseOS(local_c8);
  std::__cxx11::string::_M_dispose();
  this->OS = OVar4;
  this->Environment = UnknownEnvironment;
  this->ObjectFormat = UnknownObjectFormat;
  OVar5 = getDefaultFormat(this);
  this->ObjectFormat = OVar5;
  return;
}

Assistant:

Triple::Triple(const Twine &ArchStr, const Twine &VendorStr, const Twine &OSStr)
    : Data((ArchStr + Twine('-') + VendorStr + Twine('-') + OSStr).str()),
      Arch(parseArch(ArchStr.str())),
      SubArch(parseSubArch(ArchStr.str())),
      Vendor(parseVendor(VendorStr.str())),
      OS(parseOS(OSStr.str())),
      Environment(), ObjectFormat(Triple::UnknownObjectFormat) {
  ObjectFormat = getDefaultFormat(*this);
}